

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

void char_from_room(CHAR_DATA *ch)

{
  short *psVar1;
  ROOM_INDEX_DATA *room;
  OBJ_DATA *obj;
  ROOM_INDEX_DATA *pRVar2;
  bool bVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA **ppCVar5;
  bool bVar6;
  short sVar7;
  CHAR_DATA *pCVar8;
  ROOM_AFFECT_DATA *pRVar9;
  AFFECT_DATA *pAVar10;
  string_view fmt;
  
  room = ch->in_room;
  if (room == (ROOM_INDEX_DATA *)0x0) {
    fmt._M_str = "Char_from_room: nullptr.";
    fmt._M_len = 0x18;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  bVar3 = is_npc(ch);
  if (!bVar3) {
    psVar1 = &ch->in_room->area->nplayer;
    *psVar1 = *psVar1 + -1;
  }
  for (obj = ch->carrying; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
    if ((obj->wear_loc != -1) &&
       (((obj->item_type == 1 || (bVar3 = is_obj_stat(obj,0), bVar3)) &&
        (pRVar2 = ch->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)))) {
      sVar7 = pRVar2->light;
      if (sVar7 < 4) {
        sVar7 = 3;
      }
      pRVar2->light = sVar7 + -3;
    }
  }
  if ((ch->progtypes[0] & 0x200) != 0) {
    pCVar4 = ch->in_room->people;
    if (pCVar4 != (CHAR_DATA *)0x0) {
      bVar6 = false;
      bVar3 = false;
      do {
        if ((pCVar4 != ch) && (bVar3 = bVar6, (pCVar4->progtypes[0] & 0x200) != 0)) {
          bVar6 = true;
          bVar3 = true;
        }
        pCVar4 = pCVar4->next_in_room;
      } while (pCVar4 != (CHAR_DATA *)0x0);
      if (bVar3) goto LAB_002a4867;
    }
    ch->in_room->move_progs = false;
  }
LAB_002a4867:
  pCVar4 = ch->in_room->people;
  if (pCVar4 == ch) {
    ppCVar5 = &ch->in_room->people;
  }
  else {
    do {
      pCVar8 = pCVar4;
      if (pCVar8 == (CHAR_DATA *)0x0) goto LAB_002a48c0;
      pCVar4 = pCVar8->next_in_room;
    } while (pCVar8->next_in_room != ch);
    ppCVar5 = &pCVar8->next_in_room;
  }
  *ppCVar5 = ch->next_in_room;
LAB_002a48c0:
  ch->next_in_room = (CHAR_DATA *)0x0;
  ch->on = (OBJ_DATA *)0x0;
  ch->in_room = (ROOM_INDEX_DATA *)0x0;
  pRVar9 = (ROOM_AFFECT_DATA *)&room->affected;
  do {
    pRVar9 = pRVar9->next;
    if (pRVar9 == (ROOM_AFFECT_DATA *)0x0) goto LAB_002a4914;
  } while (pRVar9->type != gsn_gravity_well);
  pRVar9 = (ROOM_AFFECT_DATA *)&room->affected;
  do {
    pRVar9 = pRVar9->next;
    if (pRVar9 == (ROOM_AFFECT_DATA *)0x0) break;
  } while (pRVar9->type != gsn_gravity_well);
  if (pRVar9->owner == ch) {
    gravity_well_explode(room,pRVar9);
  }
LAB_002a4914:
  if (ch == (CHAR_DATA *)0x0) {
LAB_002a493b:
    bVar3 = check_entwine(ch,1);
    if ((bVar3) || (bVar3 = check_entwine(ch,2), bVar3)) {
      for (pAVar10 = ch->affected;
          (pAVar10 != (AFFECT_DATA *)0x0 &&
          ((pAVar10->type != gsn_entwine || ((pAVar10->modifier != 1 && (pAVar10->location != 2)))))
          ); pAVar10 = pAVar10->next) {
      }
      ch = pAVar10->owner;
      goto LAB_002a49d4;
    }
  }
  else {
    pAVar10 = (AFFECT_DATA *)&ch->affected;
    do {
      pAVar10 = pAVar10->next;
      if (pAVar10 == (AFFECT_DATA *)0x0) goto LAB_002a493b;
    } while (pAVar10->type != gsn_pull);
  }
  if (ch == (CHAR_DATA *)0x0) {
LAB_002a49bc:
    bVar3 = check_entwine(ch,0);
    if (bVar3) {
LAB_002a49d4:
      do_uncoil(ch,"automagic");
      return;
    }
  }
  else {
    pAVar10 = (AFFECT_DATA *)&ch->affected;
    do {
      pAVar10 = pAVar10->next;
      if (pAVar10 == (AFFECT_DATA *)0x0) goto LAB_002a49bc;
    } while (pAVar10->type != gsn_pull);
  }
  return;
}

Assistant:

void char_from_room(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *prev_room = ch->in_room;
	ROOM_AFFECT_DATA *af;
	OBJ_DATA *obj;
	CHAR_DATA *mob;
	bool other= false;
	AFFECT_DATA *aaf;

	if (ch->in_room == nullptr)
	{
		RS.Logger.Debug("Char_from_room: nullptr.");
		return;
	}

	if (!is_npc(ch))
		--ch->in_room->area->nplayer;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE)
		{
			if ((obj->item_type == ITEM_LIGHT || is_obj_stat(obj, ITEM_GLOW)) && ch->in_room)
				ch->in_room->light = std::max(0, ch->in_room->light - 3);
		}
	}

	if (IS_SET(ch->progtypes, MPROG_MOVE))
	{
		for (mob = ch->in_room->people; mob; mob = mob->next_in_room)
		{
			if (mob != ch && IS_SET(mob->progtypes, MPROG_MOVE))
				other = true;
		}

		if (!other)
			ch->in_room->move_progs = false;
	}

	if (ch == ch->in_room->people)
	{
		ch->in_room->people = ch->next_in_room;
	}
	else
	{
		CHAR_DATA *prev;

		for (prev = ch->in_room->people; prev; prev = prev->next_in_room)
		{
			if (prev->next_in_room == ch)
			{
				prev->next_in_room = ch->next_in_room;
				break;
			}
		}
		/*
		if ( prev == nullptr )
			RS.Logger.Warn("Char_from_room: ch not found.");
		*/
	}

	ch->in_room = nullptr;
	ch->next_in_room = nullptr;
	ch->on = nullptr; /* sanity check! */

	if (is_affected_room(prev_room, gsn_gravity_well))
	{
		for (af = prev_room->affected; af != nullptr; af = af->next)
		{
			if (af->type == gsn_gravity_well)
				break;
		}

		if (ch == af->owner)
			gravity_well_explode(prev_room, af);
	}
	if (!is_affected(ch, gsn_pull) && (check_entwine(ch, 1) || check_entwine(ch, 2)))
	{
		for (aaf = ch->affected; aaf != nullptr; aaf = aaf->next)
		{
			if (aaf->type == gsn_entwine && (aaf->modifier == 1 || aaf->location == APPLY_DEX))
				break;
		}

		do_uncoil(aaf->owner, "automagic");
	}
	else if (!is_affected(ch, gsn_pull) && check_entwine(ch, 0))
	{
		do_uncoil(ch, "automagic");
	}
}